

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

bool __thiscall
ON_BinaryArchive::ReadArray(ON_BinaryArchive *this,ON_SimpleArray<ON_SurfaceCurvature> *a)

{
  int iVar1;
  ON_SurfaceCurvature *p;
  bool local_1d;
  ON__INT32 local_1c;
  bool rc;
  ON_SimpleArray<ON_SurfaceCurvature> *pOStack_18;
  int count;
  ON_SimpleArray<ON_SurfaceCurvature> *a_local;
  ON_BinaryArchive *this_local;
  
  pOStack_18 = a;
  a_local = (ON_SimpleArray<ON_SurfaceCurvature> *)this;
  ON_SimpleArray<ON_SurfaceCurvature>::Empty(a);
  local_1c = 0;
  local_1d = ReadInt(this,&local_1c);
  if ((local_1d) && (0 < local_1c)) {
    ON_SimpleArray<ON_SurfaceCurvature>::SetCapacity(pOStack_18,(long)local_1c);
    iVar1 = local_1c << 1;
    p = ON_SimpleArray<ON_SurfaceCurvature>::Array(pOStack_18);
    local_1d = ReadDouble(this,(long)iVar1,&p->k1);
    if (local_1d) {
      ON_SimpleArray<ON_SurfaceCurvature>::SetCount(pOStack_18,local_1c);
    }
  }
  return local_1d;
}

Assistant:

bool
ON_BinaryArchive::ReadArray( ON_SimpleArray<ON_SurfaceCurvature>& a )
{
  a.Empty();
  int count = 0;
  bool rc = ReadInt( &count );
  if ( rc && count > 0 ) {
    a.SetCapacity( count );
    rc = ReadDouble( 2*count, &a.Array()->k1 );
    if ( rc )
      a.SetCount(count);
  }
  return rc;
}